

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O3

bool jbcoin::passesLocalChecks(STObject *st,string *reason)

{
  pointer pSVar1;
  SField *pSVar2;
  STBase *pSVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  optional<unsigned_short> oVar7;
  STArray *this;
  STBase **ppSVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  string *this_00;
  ulong uVar12;
  byte *pbVar13;
  char *pcVar14;
  pointer pSVar15;
  pointer pSVar16;
  bool bVar17;
  Serializer s;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> data;
  Serializer local_90;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> local_78;
  pointer local_58;
  string local_50;
  
  bVar5 = STObject::isFieldPresent(st,(SField *)sfMemos);
  if (bVar5) {
    this = STObject::getFieldArray(st,(SField *)sfMemos);
    Serializer::Serializer(&local_90,0x800);
    STArray::add(this,&local_90);
    if ((int)local_90.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
        (int)local_90.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start < 0x401) {
      pSVar16 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_58 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      bVar5 = true;
      if (pSVar16 != local_58) {
        do {
          if (((pSVar16->super_STBase).fName)->fieldCode != sfMemo) {
            bVar5 = false;
            std::__cxx11::string::_M_replace
                      ((ulong)reason,0,(char *)reason->_M_string_length,0x27f7a3);
            goto LAB_001b9d80;
          }
          pSVar1 = (pSVar16->v_).
                   super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pSVar15 = (pSVar16->v_).
                         super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                         ._M_impl.super__Vector_impl_data._M_start; pSVar15 != pSVar1;
              pSVar15 = pSVar15 + 1) {
            pSVar2 = pSVar15->p_->fName;
            iVar6 = pSVar2->fieldCode;
            if (((iVar6 != sfMemoType) && (iVar6 != sfMemoData)) && (iVar6 != sfMemoFormat)) {
              bVar5 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)reason,0,(char *)reason->_M_string_length,0x27f7cf);
              goto LAB_001b9d80;
            }
            (*pSVar15->p_->_vptr_STBase[6])(&local_50);
            this_00 = &local_50;
            strUnHex(&local_78,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              this_00 = (string *)(local_50.field_2._M_allocated_capacity + 1);
              operator_delete(local_50._M_dataplus._M_p,(ulong)this_00);
            }
            if (local_78.second == false) {
              iVar6 = 1;
              std::__cxx11::string::_M_replace
                        ((ulong)reason,0,(char *)reason->_M_string_length,0x27f810);
            }
            else {
              iVar6 = 5;
              if (pSVar2->fieldCode != sfMemoData) {
                if (isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols ==
                    '\0') {
                  pcVar14 = &isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::
                             allowedSymbols;
                  iVar6 = __cxa_guard_acquire();
                  if (iVar6 != 0) {
                    isMemoOkay::anon_class_1_0_00000001::operator()
                              ((array<char,_256UL> *)pcVar14,(anon_class_1_0_00000001 *)this_00);
                    __cxa_guard_release(&isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::
                                         allowedSymbols);
                  }
                }
                pbVar13 = local_78.first.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (local_78.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_78.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  iVar6 = 0;
                }
                else {
                  do {
                    if (isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols
                        [*pbVar13] == '\0') {
                      iVar6 = 1;
                      std::__cxx11::string::_M_replace
                                ((ulong)reason,0,(char *)reason->_M_string_length,0x27f860);
                      goto LAB_001b9c97;
                    }
                    pbVar13 = pbVar13 + 1;
                  } while (pbVar13 !=
                           local_78.first.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
                  iVar6 = 0;
                }
              }
            }
LAB_001b9c97:
            if (local_78.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_78.first.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.first.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.first.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((iVar6 != 5) && (iVar6 != 0)) {
              bVar5 = false;
              goto LAB_001b9d80;
            }
          }
          pSVar16 = pSVar16 + 1;
        } while (pSVar16 != local_58);
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
      std::__cxx11::string::_M_replace((ulong)reason,0,(char *)reason->_M_string_length,0x27f778);
    }
LAB_001b9d80:
    pvVar4 = (void *)CONCAT44(local_90.mData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_90.mData.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_90.mData.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4
                     );
    }
    if (!bVar5) {
      return false;
    }
  }
  pSVar15 = (st->v_).
            super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((long)(st->v_).
                      super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15 >> 5) * -0x55555555
  ;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    ppSVar8 = &pSVar15->p_;
    bVar5 = false;
    uVar12 = 1;
    do {
      pSVar3 = *ppSVar8;
      if (((pSVar3 != (STBase *)0x0) &&
          (pSVar3->_vptr_STBase == (_func_int **)&PTR__STBase_002d2ef0)) &&
         (*(char *)((long)&pSVar3[2]._vptr_STBase + 4) != '\0')) break;
      bVar5 = uVar10 <= uVar12;
      ppSVar8 = ppSVar8 + 0xc;
      bVar17 = uVar12 != uVar10;
      uVar12 = uVar12 + 1;
    } while (bVar17);
    if (!bVar5) {
      pcVar14 = (char *)reason->_M_string_length;
      pcVar11 = "An account field is invalid.";
      goto LAB_001b9e7e;
    }
  }
  local_78.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&sfTransactionType;
  oVar7 = STObject::operator[]<jbcoin::STInteger<unsigned_short>>
                    (st,(OptionaledField<jbcoin::STInteger<unsigned_short>_> *)&local_78);
  if (((uint)oVar7.super_type & 0xfffe0000) != 0x640000 ||
      (~oVar7.super_type.m_initialized & 1U) != 0) {
    return true;
  }
  pcVar14 = (char *)reason->_M_string_length;
  pcVar11 = "Cannot submit pseudo transactions.";
LAB_001b9e7e:
  std::__cxx11::string::_M_replace((ulong)reason,0,pcVar14,(ulong)pcVar11);
  return false;
}

Assistant:

bool passesLocalChecks (STObject const& st, std::string& reason)
{
    if (!isMemoOkay (st, reason))
        return false;

    if (!isAccountFieldOkay (st))
    {
        reason = "An account field is invalid.";
        return false;
    }

    if (isPseudoTx(st))
    {
        reason = "Cannot submit pseudo transactions.";
        return false;
    }
    return true;
}